

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tokenstream.cpp
# Opt level: O0

bool __thiscall embree::TokenStream::tryFloat(TokenStream *this,Token *token,ParseLocation *loc)

{
  bool bVar1;
  int iVar2;
  TokenStream *this_00;
  int *piVar3;
  char *__nptr;
  long in_RDI;
  string str;
  bool ok;
  Token *in_stack_fffffffffffffc08;
  undefined4 in_stack_fffffffffffffc10;
  int in_stack_fffffffffffffc14;
  undefined8 in_stack_fffffffffffffc18;
  float f;
  Token *in_stack_fffffffffffffc20;
  string *in_stack_fffffffffffffc28;
  TokenStream *in_stack_fffffffffffffc30;
  Stream<int> *in_stack_fffffffffffffc88;
  Stream<int> *this_01;
  string *in_stack_fffffffffffffca8;
  TokenStream *in_stack_fffffffffffffcb0;
  allocator local_229;
  string local_228 [143];
  allocator local_199;
  string local_198 [36];
  undefined4 local_174;
  allocator local_f1;
  string local_f0 [32];
  string local_d0 [39];
  byte local_a9;
  byte local_89;
  long local_88;
  undefined8 *local_80;
  undefined8 *local_78;
  long local_70;
  long local_68;
  long local_60;
  long local_58;
  long local_50;
  undefined8 *local_48;
  long local_40;
  undefined8 *local_38;
  long local_30;
  long local_28;
  long local_20;
  undefined1 *local_18;
  undefined1 *local_10;
  undefined1 *local_8;
  
  f = (float)((ulong)in_stack_fffffffffffffc18 >> 0x20);
  local_a9 = 0;
  std::__cxx11::string::string(local_d0);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_f0,"nan",&local_f1);
  bVar1 = trySymbol(in_stack_fffffffffffffc30,in_stack_fffffffffffffc28);
  std::__cxx11::string::~string(local_f0);
  std::allocator<char>::~allocator((allocator<char> *)&local_f1);
  if (bVar1) {
    local_18 = &nan;
    std::numeric_limits<float>::quiet_NaN();
    ParseLocation::ParseLocation
              ((ParseLocation *)CONCAT44(in_stack_fffffffffffffc14,in_stack_fffffffffffffc10));
    Token::Token(in_stack_fffffffffffffc20,f,
                 (ParseLocation *)CONCAT44(in_stack_fffffffffffffc14,in_stack_fffffffffffffc10));
    Token::operator=((Token *)CONCAT44(in_stack_fffffffffffffc14,in_stack_fffffffffffffc10),
                     in_stack_fffffffffffffc08);
    Token::~Token((Token *)CONCAT44(in_stack_fffffffffffffc14,in_stack_fffffffffffffc10));
    ParseLocation::~ParseLocation((ParseLocation *)0x47594a);
    local_89 = 1;
    goto LAB_00476284;
  }
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_198,"+inf",&local_199);
  bVar1 = trySymbol(in_stack_fffffffffffffc30,in_stack_fffffffffffffc28);
  std::__cxx11::string::~string(local_198);
  std::allocator<char>::~allocator((allocator<char> *)&local_199);
  if (bVar1) {
    local_10 = &pos_inf;
    std::numeric_limits<float>::infinity();
    ParseLocation::ParseLocation
              ((ParseLocation *)CONCAT44(in_stack_fffffffffffffc14,in_stack_fffffffffffffc10));
    Token::Token(in_stack_fffffffffffffc20,f,
                 (ParseLocation *)CONCAT44(in_stack_fffffffffffffc14,in_stack_fffffffffffffc10));
    Token::operator=((Token *)CONCAT44(in_stack_fffffffffffffc14,in_stack_fffffffffffffc10),
                     in_stack_fffffffffffffc08);
    Token::~Token((Token *)CONCAT44(in_stack_fffffffffffffc14,in_stack_fffffffffffffc10));
    ParseLocation::~ParseLocation((ParseLocation *)0x475ae0);
    local_89 = 1;
    goto LAB_00476284;
  }
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_228,"-inf",&local_229);
  bVar1 = trySymbol(in_stack_fffffffffffffc30,in_stack_fffffffffffffc28);
  std::__cxx11::string::~string(local_228);
  std::allocator<char>::~allocator((allocator<char> *)&local_229);
  if (bVar1) {
    local_8 = &neg_inf;
    std::numeric_limits<float>::infinity();
    ParseLocation::ParseLocation
              ((ParseLocation *)CONCAT44(in_stack_fffffffffffffc14,in_stack_fffffffffffffc10));
    Token::Token(in_stack_fffffffffffffc20,f,
                 (ParseLocation *)CONCAT44(in_stack_fffffffffffffc14,in_stack_fffffffffffffc10));
    Token::operator=((Token *)CONCAT44(in_stack_fffffffffffffc14,in_stack_fffffffffffffc10),
                     in_stack_fffffffffffffc08);
    Token::~Token((Token *)CONCAT44(in_stack_fffffffffffffc14,in_stack_fffffffffffffc10));
    ParseLocation::~ParseLocation((ParseLocation *)0x475c6a);
    local_89 = 1;
    goto LAB_00476284;
  }
  bVar1 = decDigits(in_stack_fffffffffffffcb0,in_stack_fffffffffffffca8);
  if (bVar1) {
    local_20 = in_RDI + 0x40;
    piVar3 = Stream<int>::peek(in_stack_fffffffffffffc88);
    if (*piVar3 == 0x2e) {
      local_28 = in_RDI + 0x40;
      iVar2 = Stream<int>::get(in_stack_fffffffffffffc88);
      std::__cxx11::string::operator+=(local_d0,(char)iVar2);
      decDigits(in_stack_fffffffffffffcb0,in_stack_fffffffffffffca8);
      local_30 = in_RDI + 0x40;
      this_00 = (TokenStream *)Stream<int>::peek(in_stack_fffffffffffffc88);
      if (*(int *)&(this_00->super_Stream<embree::Token>).super_RefCount._vptr_RefCount != 0x65) {
        local_38 = (undefined8 *)(in_RDI + 0x40);
        in_stack_fffffffffffffca8 = (string *)*local_38;
        piVar3 = Stream<int>::peek(in_stack_fffffffffffffc88);
        if (*piVar3 != 0x45) {
          local_a9 = 1;
          goto LAB_004761cb;
        }
      }
      local_40 = in_RDI + 0x40;
      iVar2 = Stream<int>::get(in_stack_fffffffffffffc88);
      std::__cxx11::string::operator+=(local_d0,(char)iVar2);
      bVar1 = decDigits(this_00,in_stack_fffffffffffffca8);
      if (bVar1) {
        local_a9 = 1;
      }
    }
    else {
      local_48 = (undefined8 *)(in_RDI + 0x40);
      this_01 = (Stream<int> *)*local_48;
      piVar3 = Stream<int>::peek(this_01);
      if (*piVar3 != 0x65) {
        local_50 = in_RDI + 0x40;
        piVar3 = Stream<int>::peek(this_01);
        if (*piVar3 != 0x45) goto LAB_004761cb;
      }
      local_58 = in_RDI + 0x40;
      iVar2 = Stream<int>::get(this_01);
      std::__cxx11::string::operator+=(local_d0,(char)iVar2);
      bVar1 = decDigits(in_stack_fffffffffffffcb0,in_stack_fffffffffffffca8);
      if (bVar1) {
        local_a9 = 1;
      }
    }
  }
  else {
    local_60 = in_RDI + 0x40;
    piVar3 = Stream<int>::peek(in_stack_fffffffffffffc88);
    if (*piVar3 == 0x2e) {
      local_68 = in_RDI + 0x40;
      iVar2 = Stream<int>::get(in_stack_fffffffffffffc88);
      std::__cxx11::string::operator+=(local_d0,(char)iVar2);
      bVar1 = decDigits(in_stack_fffffffffffffcb0,in_stack_fffffffffffffca8);
      if (bVar1) {
        local_70 = in_RDI + 0x40;
        in_stack_fffffffffffffc30 = (TokenStream *)Stream<int>::peek(in_stack_fffffffffffffc88);
        if (*(int *)&(in_stack_fffffffffffffc30->super_Stream<embree::Token>).super_RefCount.
                     _vptr_RefCount != 0x65) {
          local_78 = (undefined8 *)(in_RDI + 0x40);
          in_stack_fffffffffffffc28 = (string *)*local_78;
          in_stack_fffffffffffffc20 = (Token *)Stream<int>::peek(in_stack_fffffffffffffc88);
          if (in_stack_fffffffffffffc20->ty != 0x45) {
            local_a9 = 1;
            goto LAB_004761cb;
          }
        }
        local_80 = (undefined8 *)(in_RDI + 0x40);
        f = (float)((ulong)*local_80 >> 0x20);
        in_stack_fffffffffffffc14 = Stream<int>::get(in_stack_fffffffffffffc88);
        std::__cxx11::string::operator+=(local_d0,(char)in_stack_fffffffffffffc14);
        bVar1 = decDigits(in_stack_fffffffffffffcb0,in_stack_fffffffffffffca8);
        in_stack_fffffffffffffc10 = CONCAT13(bVar1,(int3)in_stack_fffffffffffffc10);
        if (bVar1) {
          local_a9 = 1;
        }
      }
    }
  }
LAB_004761cb:
  if ((local_a9 & 1) == 0) {
    local_88 = in_RDI + 0x40;
    std::__cxx11::string::size();
    Stream<int>::unget((Stream<int> *)in_stack_fffffffffffffc30,(size_t)in_stack_fffffffffffffc28);
  }
  else {
    __nptr = (char *)std::__cxx11::string::c_str();
    atof(__nptr);
    Token::Token(in_stack_fffffffffffffc20,f,
                 (ParseLocation *)CONCAT44(in_stack_fffffffffffffc14,in_stack_fffffffffffffc10));
    Token::operator=((Token *)CONCAT44(in_stack_fffffffffffffc14,in_stack_fffffffffffffc10),
                     in_stack_fffffffffffffc08);
    Token::~Token((Token *)CONCAT44(in_stack_fffffffffffffc14,in_stack_fffffffffffffc10));
  }
  local_89 = local_a9 & 1;
LAB_00476284:
  local_174 = 1;
  std::__cxx11::string::~string(local_d0);
  return (bool)(local_89 & 1);
}

Assistant:

bool TokenStream::tryFloat(Token& token, const ParseLocation& loc)
  {
    bool ok = false;
    std::string str;
    if (trySymbol("nan")) {
      token = Token(float(nan));
      return true;
    }
    if (trySymbol("+inf")) {
      token = Token(float(pos_inf));
      return true;
    }
    if (trySymbol("-inf")) {
      token = Token(float(neg_inf));
      return true;
    }

    if (decDigits(str))
    {
      if (cin->peek() == '.') {
        str += (char)cin->get();
        decDigits(str);
        if (cin->peek() == 'e' || cin->peek() == 'E') {
          str += (char)cin->get();
          if (decDigits(str)) ok = true; // 1.[2]E2
        }
        else ok = true; // 1.[2]
      }
      else if (cin->peek() == 'e' || cin->peek() == 'E') {
        str += (char)cin->get();
        if (decDigits(str)) ok = true; // 1E2
      }
    }
    else
    {
      if (cin->peek() == '.') {
        str += (char)cin->get();
        if (decDigits(str)) {
          if (cin->peek() == 'e' || cin->peek() == 'E') {
            str += (char)cin->get();
            if (decDigits(str)) ok = true; // .3E2
          }
          else ok = true; // .3
        }
      }
    }
    if (ok) {
      token = Token((float)atof(str.c_str()),loc);
    }
    else cin->unget(str.size());
    return ok;
  }